

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O3

string * __thiscall
spirv_cross::CompilerGLSL::address_of_expression
          (string *__return_storage_ptr__,CompilerGLSL *this,string *expr)

{
  char *pcVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_1;
  spirv_cross local_39;
  string local_38;
  
  pcVar1 = (expr->_M_dataplus)._M_p;
  ts_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)expr->_M_string_length
  ;
  if (*pcVar1 == '(' &&
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3 < ts_1) {
    if ((pcVar1[1] == '*') && ((pcVar1 + -1)[(long)ts_1] == ')')) {
      ::std::__cxx11::string::substr((ulong)&local_38,(ulong)expr);
      enclose_expression(__return_storage_ptr__,(CompilerGLSL *)expr,&local_38);
      goto LAB_002cc2f6;
    }
  }
  else if (*pcVar1 == '*') {
    ::std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)expr);
    return __return_storage_ptr__;
  }
  local_39 = (spirv_cross)0x26;
  enclose_expression(&local_38,(CompilerGLSL *)expr,expr);
  join<char,std::__cxx11::string>(__return_storage_ptr__,&local_39,(char *)&local_38,ts_1);
LAB_002cc2f6:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

string CompilerGLSL::address_of_expression(const std::string &expr)
{
	if (expr.size() > 3 && expr[0] == '(' && expr[1] == '*' && expr.back() == ')')
	{
		// If we have an expression which looks like (*foo), taking the address of it is the same as stripping
		// the first two and last characters. We might have to enclose the expression.
		// This doesn't work for cases like (*foo + 10),
		// but this is an r-value expression which we cannot take the address of anyways.
		return enclose_expression(expr.substr(2, expr.size() - 3));
	}
	else if (expr.front() == '*')
	{
		// If this expression starts with a dereference operator ('*'), then
		// just return the part after the operator.
		return expr.substr(1);
	}
	else
		return join('&', enclose_expression(expr));
}